

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate.c
# Opt level: O0

int dsSync(int block)

{
  int iVar1;
  dsCrate *pdVar2;
  int flags;
  dsCrate *crate;
  int block_local;
  
  pdVar2 = getActiveCrate();
  if (pdVar2 == (dsCrate *)0x0) {
    dsRunLogCallback("%s(): Can\'t get active crate.\n","dsSync");
    crate._4_4_ = -1;
  }
  else {
    iVar1 = 1;
    if (block != 0) {
      iVar1 = 4;
    }
    iVar1 = msync((pdVar2->map).ptr,(pdVar2->map).length,iVar1);
    if (iVar1 < 0) {
      dsRunLogCallback("%s(): Can\'t synchronize crate.\n","dsSync");
      crate._4_4_ = -1;
    }
    else {
      crate._4_4_ = 0;
    }
  }
  return crate._4_4_;
}

Assistant:

int
dsSync(int block)
{
	dsCrate *crate;

	if ((crate = getActiveCrate()) == NULL) {
		dsLog("Can't get active crate.\n");
		return -1;
	}

	int flags = block ? MS_SYNC : MS_ASYNC;

	if (msync(crate->map.ptr, crate->map.length, flags) < 0) {
		dsLog("Can't synchronize crate.\n");
		return -1;
	}

	return 0;
}